

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.c
# Opt level: O3

int fy_scan_yaml_version(fy_parser *fyp,fy_atom *handle)

{
  int iVar1;
  
  handle->storage_hint = 0;
  handle->fyi = (fy_input *)0x0;
  (handle->end_mark).input_pos = 0;
  (handle->end_mark).line = 0;
  (handle->end_mark).column = 0;
  (handle->start_mark).input_pos = 0;
  (handle->start_mark).line = 0;
  (handle->start_mark).column = 0;
  *(undefined8 *)&handle->increment = 0;
  while( true ) {
    iVar1 = fy_parse_peek_at_offset(fyp,0);
    if ((iVar1 != 0x20) && (iVar1 != 9)) break;
    fy_advance(fyp,iVar1);
  }
  iVar1 = fy_scan_yaml_version_length(fyp);
  if (iVar1 < 1) {
    fy_parser_diag(fyp,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                   ,0x594,"fy_scan_yaml_version","fy_scan_yaml_version_length() failed");
    iVar1 = -1;
  }
  else {
    fy_fill_atom(fyp,iVar1,handle);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int fy_scan_yaml_version(struct fy_parser *fyp, struct fy_atom *handle) {
    int c, length;

    memset(handle, 0, sizeof(*handle));

    /* skip white space */
    while (fy_is_ws(c = fy_parse_peek(fyp)))
        fy_advance(fyp, c);

    length = fy_scan_yaml_version_length(fyp);
    fyp_error_check(fyp, length > 0, err_out,
                    "fy_scan_yaml_version_length() failed");

    fy_fill_atom(fyp, length, handle);

    return 0;

    err_out:
    return -1;
}